

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlInitializeCatalog(void)

{
  xmlCatalogPtr pxVar1;
  byte *pbVar2;
  xmlCatalogPtr pxVar3;
  ulong uVar4;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar5;
  xmlCatalogEntryPtr pxVar6;
  byte *cur;
  long lVar7;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitParser();
    xmlRMutexLock(&xmlCatalogMutex);
    pxVar1 = xmlDefaultCatalog;
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      pbVar2 = (byte *)getenv("XML_CATALOG_FILES");
      pxVar3 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
      pxVar1 = xmlDefaultCatalog;
      if (pxVar3 != (xmlCatalogPtr)0x0) {
        cur = (byte *)"file:///usr/local/etc/xml/catalog";
        if (pbVar2 != (byte *)0x0) {
          cur = pbVar2;
        }
        pxVar1 = pxVar3;
        if (*cur != 0) {
          pxVar6 = (xmlCatalogEntryPtr)&pxVar3->xml;
LAB_001652f9:
          do {
            uVar4 = (ulong)*cur;
            if (uVar4 < 0x21) {
              if ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0) {
                cur = cur + 1;
                goto LAB_001652f9;
              }
              if (uVar4 != 0) goto LAB_00165313;
            }
            else {
LAB_00165313:
              lVar7 = 0;
              while ((0x20 < (ulong)cur[lVar7] ||
                     ((0x100002601U >> ((ulong)cur[lVar7] & 0x3f) & 1) == 0))) {
                lVar7 = lVar7 + 1;
              }
              URL = xmlStrndup(cur,(int)lVar7);
              cur = cur + lVar7;
              if (URL != (xmlChar *)0x0) {
                pxVar5 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                            xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
                pxVar6->next = pxVar5;
                if (pxVar5 != (xmlCatalogEntryPtr)0x0) {
                  pxVar6 = pxVar5;
                }
                (*xmlFree)(URL);
              }
            }
          } while (*cur != 0);
        }
      }
    }
    xmlDefaultCatalog = pxVar1;
    xmlRMutexUnlock(&xmlCatalogMutex);
    xmlCatalogInitialized = '\x01';
  }
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitParser();

    xmlRMutexLock(&xmlCatalogMutex);

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
	    catalogs = XML_XML_DEFAULT_CATALOG;

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(&xmlCatalogMutex);

    xmlCatalogInitialized = 1;
}